

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

Matcher<const_std::tuple<mp::LogicalCountExpr>_&> *
testing::A<std::tuple<mp::LogicalCountExpr>const&>(void)

{
  void *__s;
  Matcher<const_std::tuple<mp::LogicalCountExpr>_&> *in_RDI;
  MatcherInterface<const_std::tuple<mp::LogicalCountExpr>_&> *in_stack_ffffffffffffffd8;
  Matcher<const_std::tuple<mp::LogicalCountExpr>_&> *this;
  
  this = in_RDI;
  __s = operator_new(8);
  memset(__s,0,8);
  internal::AnyMatcherImpl<const_std::tuple<mp::LogicalCountExpr>_&>::AnyMatcherImpl
            ((AnyMatcherImpl<const_std::tuple<mp::LogicalCountExpr>_&> *)this);
  MakeMatcher<std::tuple<mp::LogicalCountExpr>const&>(in_stack_ffffffffffffffd8);
  return in_RDI;
}

Assistant:

inline Matcher<T> A() { return MakeMatcher(new internal::AnyMatcherImpl<T>()); }